

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_access(void)

{
  ssize_t sVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  uv_fs_t req;
  
  unlink("test_file");
  rmdir("test_dir");
  loop = uv_default_loop();
  iVar2 = uv_fs_access((uv_loop_t *)0x0,&req,"test_file",0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    if (req.result < 0) {
      uv_fs_req_cleanup(&req);
      iVar2 = uv_fs_access(loop,&req,"test_file",0,access_cb);
      if (iVar2 == 0) {
        uv_run(loop,UV_RUN_DEFAULT);
        if (access_cb_count == 1) {
          access_cb_count = 0;
          iVar2 = uv_fs_open((uv_loop_t *)0x0,&req,"test_file",0x42,0x180,(uv_fs_cb)0x0);
          sVar1 = req.result;
          if (iVar2 < 0) {
            pcVar5 = "r >= 0";
            uVar4 = 0x5d5;
          }
          else if (req.result < 0) {
            pcVar5 = "req.result >= 0";
            uVar4 = 0x5d6;
          }
          else {
            uv_fs_req_cleanup(&req);
            iVar2 = uv_fs_access((uv_loop_t *)0x0,&req,"test_file",0,(uv_fs_cb)0x0);
            if (iVar2 == 0) {
              if (req.result == 0) {
                uv_fs_req_cleanup(&req);
                iVar2 = uv_fs_access(loop,&req,"test_file",0,access_cb);
                if (iVar2 == 0) {
                  uv_run(loop,UV_RUN_DEFAULT);
                  if (access_cb_count == 1) {
                    access_cb_count = 0;
                    iVar2 = uv_fs_close((uv_loop_t *)0x0,&req,(uv_file)sVar1,(uv_fs_cb)0x0);
                    if (iVar2 == 0) {
                      if (req.result == 0) {
                        uv_fs_req_cleanup(&req);
                        iVar2 = uv_fs_mkdir((uv_loop_t *)0x0,&req,"test_dir",0x1ff,(uv_fs_cb)0x0);
                        if (iVar2 == 0) {
                          uv_fs_req_cleanup(&req);
                          iVar2 = uv_fs_access((uv_loop_t *)0x0,&req,"test_dir",2,(uv_fs_cb)0x0);
                          if (iVar2 == 0) {
                            if (req.result == 0) {
                              uv_fs_req_cleanup(&req);
                              uv_run(loop,UV_RUN_DEFAULT);
                              unlink("test_file");
                              rmdir("test_dir");
                              puVar3 = uv_default_loop();
                              close_loop(puVar3);
                              puVar3 = uv_default_loop();
                              iVar2 = uv_loop_close(puVar3);
                              if (iVar2 == 0) {
                                return 0;
                              }
                              pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                              uVar4 = 0x601;
                            }
                            else {
                              pcVar5 = "req.result == 0";
                              uVar4 = 0x5f4;
                            }
                          }
                          else {
                            pcVar5 = "r == 0";
                            uVar4 = 0x5f3;
                          }
                        }
                        else {
                          pcVar5 = "r == 0";
                          uVar4 = 0x5ef;
                        }
                      }
                      else {
                        pcVar5 = "req.result == 0";
                        uVar4 = 0x5ea;
                      }
                    }
                    else {
                      pcVar5 = "r == 0";
                      uVar4 = 0x5e9;
                    }
                  }
                  else {
                    pcVar5 = "access_cb_count == 1";
                    uVar4 = 0x5e4;
                  }
                }
                else {
                  pcVar5 = "r == 0";
                  uVar4 = 0x5e2;
                }
              }
              else {
                pcVar5 = "req.result == 0";
                uVar4 = 0x5dd;
              }
            }
            else {
              pcVar5 = "r == 0";
              uVar4 = 0x5dc;
            }
          }
        }
        else {
          pcVar5 = "access_cb_count == 1";
          uVar4 = 0x5cf;
        }
      }
      else {
        pcVar5 = "r == 0";
        uVar4 = 0x5cd;
      }
    }
    else {
      pcVar5 = "req.result < 0";
      uVar4 = 0x5c8;
    }
  }
  else {
    pcVar5 = "r < 0";
    uVar4 = 0x5c7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(fs_access) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  rmdir("test_dir");

  loop = uv_default_loop();

  /* File should not exist */
  r = uv_fs_access(NULL, &req, "test_file", F_OK, NULL);
  ASSERT(r < 0);
  ASSERT(req.result < 0);
  uv_fs_req_cleanup(&req);

  /* File should not exist */
  r = uv_fs_access(loop, &req, "test_file", F_OK, access_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(access_cb_count == 1);
  access_cb_count = 0; /* reset for the next test */

  /* Create file */
  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* File should exist */
  r = uv_fs_access(NULL, &req, "test_file", F_OK, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* File should exist */
  r = uv_fs_access(loop, &req, "test_file", F_OK, access_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(access_cb_count == 1);
  access_cb_count = 0; /* reset for the next test */

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* Directory access */
  r = uv_fs_mkdir(NULL, &req, "test_dir", 0777, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_access(NULL, &req, "test_dir", W_OK, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}